

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O0

KBOOL __thiscall
KDIS::DATA_TYPE::GridDataType0::operator==(GridDataType0 *this,GridDataType0 *Value)

{
  KBOOL KVar1;
  bool bVar2;
  GridDataType0 *Value_local;
  GridDataType0 *this_local;
  
  KVar1 = GridData::operator!=(&this->super_GridData,&Value->super_GridData);
  if (KVar1) {
    this_local._7_1_ = false;
  }
  else if (*(short *)&(this->super_GridData).field_0xc ==
           *(short *)&(Value->super_GridData).field_0xc) {
    bVar2 = std::operator!=(&this->m_vui8DataVals,&Value->m_vui8DataVals);
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL GridDataType0::operator == ( const GridDataType0 & Value ) const
{
    if( GridData::operator != ( Value ) )         return false;
    if( m_ui16NumBytes != Value.m_ui16NumBytes )  return false;
    if( m_vui8DataVals  != Value.m_vui8DataVals ) return false;
    return true;
}